

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  size_t *this_00;
  cmSourceFile *this_01;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  const_reference pvVar4;
  cmGeneratorTarget *this_02;
  ostream *poVar5;
  reference ppcVar6;
  pointer ppVar7;
  cmMakefile *this_03;
  allocator local_6a1;
  string local_6a0;
  cmSourceFile *local_680;
  cmSourceFile *sf;
  string objFile;
  _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  const_iterator map_it;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_640;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_638;
  const_iterator it_1;
  char *sep;
  undefined1 local_620 [8];
  string obj_dir;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_5f8;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_5f0;
  const_iterator it;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string local_580;
  undefined1 local_560 [8];
  ostringstream e_2;
  string local_3e0;
  string local_3c0;
  undefined1 local_3a0 [8];
  ostringstream e_1;
  cmGeneratorTarget *gt;
  string tgtName;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream e;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetObjectsNode *this_local;
  string *result;
  
  if ((context->EvaluateForBuildsystem & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,
                    "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake.  It is not suitable for writing out elsewhere."
                   );
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1e0,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_1e0,(string *)((long)&tgtName.field_2 + 8));
    std::__cxx11::string::~string((string *)(tgtName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(parameters);
    std::__cxx11::string::string((string *)&gt,(string *)pvVar4);
    this_02 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,(string *)&gt);
    if (this_02 == (cmGeneratorTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
      poVar5 = std::operator<<((ostream *)local_3a0,"Objects of target \"");
      poVar5 = std::operator<<(poVar5,(string *)&gt);
      std::operator<<(poVar5,"\" referenced but no such target exists.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3c0,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3c0,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
    }
    else {
      TVar3 = cmGeneratorTarget::GetType(this_02);
      if (TVar3 == OBJECT_LIBRARY) {
        this_00 = &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)this_00);
        cmGeneratorTarget::GetObjectSources
                  (this_02,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                           this_00,&context->Config);
        std::
        map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&it);
        local_5f8._M_current =
             (cmSourceFile **)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __gnu_cxx::
        __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
        ::__normal_iterator<cmSourceFile_const**>
                  ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                    *)&local_5f0,&local_5f8);
        while( true ) {
          obj_dir.field_2._8_8_ =
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = __gnu_cxx::operator!=
                            (&local_5f0,
                             (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                              *)((long)&obj_dir.field_2 + 8));
          if (!bVar1) break;
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                    ::operator*(&local_5f0);
          std::
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&it,ppcVar6);
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&local_5f0);
        }
        (*this_02->LocalGenerator->_vptr_cmLocalGenerator[0xc])(this_02->LocalGenerator,&it);
        std::__cxx11::string::string((string *)local_620,(string *)&this_02->ObjectDirectory);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        it_1._M_current = (cmSourceFile **)0xad0413;
        local_640._M_current =
             (cmSourceFile **)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __gnu_cxx::
        __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
        ::__normal_iterator<cmSourceFile_const**>
                  ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                    *)&local_638,&local_640);
        while( true ) {
          map_it._M_node =
               (_Base_ptr)
               std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = __gnu_cxx::operator!=
                            (&local_638,
                             (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                              *)&map_it);
          if (!bVar1) break;
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                    ::operator*(&local_638);
          objFile.field_2._8_8_ =
               std::
               map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&it,ppcVar6);
          std::
          _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree_const_iterator(&local_650,(iterator *)((long)&objFile.field_2 + 8));
          std::
          _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_650);
          bVar2 = std::__cxx11::string::empty();
          if (((bVar2 ^ 0xff) & 1) == 0) {
            __assert_fail("!map_it->second.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                          ,0x520,
                          "virtual std::string TargetObjectsNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                         );
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)it_1._M_current)
          ;
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_650);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_620,&ppVar7->second);
          this_03 = cmLocalGenerator::GetMakefile(context->LG);
          local_680 = cmMakefile::GetOrCreateSource(this_03,(string *)&sf,true);
          cmSourceFile::SetObjectLibrary(local_680,(string *)&gt);
          this_01 = local_680;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_6a0,"EXTERNAL_OBJECT",&local_6a1);
          cmSourceFile::SetProperty(this_01,&local_6a0,"1");
          std::__cxx11::string::~string((string *)&local_6a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&sf);
          it_1._M_current = (cmSourceFile **)0xa8067f;
          std::__cxx11::string::~string((string *)&sf);
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&local_638);
        }
        std::__cxx11::string::~string((string *)local_620);
        std::
        map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&it);
        std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                   &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
        poVar5 = std::operator<<((ostream *)local_560,"Objects of target \"");
        poVar5 = std::operator<<(poVar5,(string *)&gt);
        std::operator<<(poVar5,"\" referenced but is not an OBJECT library.");
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_580,content);
        std::__cxx11::ostringstream::str();
        reportError(context,&local_580,
                    (string *)
                    &objectSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &objectSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
      }
    }
    std::__cxx11::string::~string((string *)&gt);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *) const
  {
    if (!context->EvaluateForBuildsystem)
      {
      std::ostringstream e;
      e << "The evaluation of the TARGET_OBJECTS generator expression "
        "is only suitable for consumption by CMake.  It is not suitable "
        "for writing out elsewhere.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }

    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt =
                context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt)
      {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }
    if (gt->GetType() != cmState::OBJECT_LIBRARY)
      {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an OBJECT library.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
      }

    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, context->Config);
    std::map<cmSourceFile const*, std::string> mapping;

    for(std::vector<cmSourceFile const*>::const_iterator it
        = objectSources.begin(); it != objectSources.end(); ++it)
      {
      mapping[*it];
      }

    gt->LocalGenerator->ComputeObjectFilenames(mapping, gt);

    std::string obj_dir = gt->ObjectDirectory;
    std::string result;
    const char* sep = "";
    for(std::vector<cmSourceFile const*>::const_iterator it
        = objectSources.begin(); it != objectSources.end(); ++it)
      {
      // Find the object file name corresponding to this source file.
      std::map<cmSourceFile const*, std::string>::const_iterator
        map_it = mapping.find(*it);
      // It must exist because we populated the mapping just above.
      assert(!map_it->second.empty());
      result += sep;
      std::string objFile = obj_dir + map_it->second;
      cmSourceFile* sf =
          context->LG->GetMakefile()->GetOrCreateSource(objFile, true);
      sf->SetObjectLibrary(tgtName);
      sf->SetProperty("EXTERNAL_OBJECT", "1");
      result += objFile;
      sep = ";";
      }
    return result;
  }